

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 float128_add_aarch64(float128 a,float128 b,float_status *status)

{
  byte zSign;
  float128 fVar1;
  
  zSign = a.high._7_1_ >> 7;
  if (a.high >> 0x3f == b.high >> 0x3f) {
    fVar1 = addFloat128Sigs(a,b,zSign,status);
    return fVar1;
  }
  fVar1 = subFloat128Sigs(a,b,zSign,status);
  return fVar1;
}

Assistant:

float128 float128_add(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign;

    aSign = extractFloat128Sign( a );
    bSign = extractFloat128Sign( b );
    if ( aSign == bSign ) {
        return addFloat128Sigs(a, b, aSign, status);
    }
    else {
        return subFloat128Sigs(a, b, aSign, status);
    }

}